

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tutorial.cpp
# Opt level: O1

void __thiscall embree::TutorialApplication::renderInteractive(TutorialApplication *this)

{
  uint width;
  uint height;
  int iVar1;
  GLFWwindow *handle;
  TutorialApplication *this_00;
  
  this->window_width = this->width;
  this->window_height = this->height;
  glfwSetErrorCallback(errorFunc);
  glfwInit();
  glfwWindowHint(0x22002,2);
  glfwWindowHint(0x22003,0);
  if (this->fullscreen == true) {
    handle = createFullScreenWindow(this);
  }
  else {
    width = this->width;
    height = this->height;
    handle = glfwCreateWindow(width,height,(this->tutorialName)._M_dataplus._M_p,(GLFWmonitor *)0x0,
                              (GLFWwindow *)0x0);
    resize(this,width,height);
  }
  this->window = handle;
  glfwMakeContextCurrent(handle);
  glfwSwapInterval(0);
  (*(this->super_Application)._vptr_Application[9])(this,this->window,0,0);
  ImGui::CreateContext((ImFontAtlas *)0x0);
  ImGui::GetIO();
  this_00 = (TutorialApplication *)this->window;
  ImGui_ImplGlfw_InitForOpenGL((GLFWwindow *)this_00,true);
  ImGui_ImplOpenGL2_Init();
  setCallbackFunctions(this_00,this->window);
  ImGui::StyleColorsDark((ImGuiStyle *)0x0);
  while( true ) {
    iVar1 = glfwWindowShouldClose(this->window);
    if (iVar1 != 0) break;
    glfwPollEvents();
    (*(this->super_Application)._vptr_Application[8])(this);
  }
  ImGui_ImplOpenGL2_Shutdown();
  ImGui_ImplGlfw_Shutdown();
  ImGui::DestroyContext((ImGuiContext *)0x0);
  glfwDestroyWindow(this->window);
  glfwTerminate();
  return;
}

Assistant:

void TutorialApplication::renderInteractive()
  {
    window_width = width;
    window_height = height;
    glfwSetErrorCallback(errorFunc);
    glfwInit();
    glfwWindowHint(GLFW_CONTEXT_VERSION_MAJOR,2);
    glfwWindowHint(GLFW_CONTEXT_VERSION_MINOR,0);

    if (fullscreen) window = createFullScreenWindow();
    else            window = createStandardWindow(width,height);

    glfwMakeContextCurrent(window);
    glfwSwapInterval(0);
    reshapeFunc(window,0,0);

    ImGui::CreateContext();
    ImGuiIO& io = ImGui::GetIO(); (void)io;

    ImGui_ImplGlfw_InitForOpenGL(window, true);
    ImGui_ImplOpenGL2_Init();

    setCallbackFunctions(window);

    // Setup style
    ImGui::StyleColorsDark();

    while (!glfwWindowShouldClose(window))
    {
      glfwPollEvents();

      displayFunc();
    }

    // Cleanup
    ImGui_ImplOpenGL2_Shutdown();
    ImGui_ImplGlfw_Shutdown();
    ImGui::DestroyContext();

    glfwDestroyWindow(window);
    glfwTerminate();
  }